

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O3

UBool __thiscall icu_63::LocaleKey::isFallbackOf(LocaleKey *this,UnicodeString *id)

{
  ushort uVar1;
  short sVar2;
  int32_t iVar3;
  uint uVar4;
  bool bVar5;
  int srcLength;
  char16_t *srcChars;
  undefined4 length;
  UnicodeString temp;
  UnicodeString UStack_58;
  
  UnicodeString::UnicodeString(&UStack_58,id);
  ICUServiceKey::parseSuffix(&UStack_58);
  uVar1 = (this->_primaryID).fUnion.fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    srcLength = (this->_primaryID).fUnion.fFields.fLength;
  }
  else {
    srcLength = (int)(short)uVar1 >> 5;
  }
  length = UStack_58.fUnion.fFields.fLength;
  if (-1 < UStack_58.fUnion.fStackFields.fLengthAndFlags) {
    length = (int)UStack_58.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  bVar5 = false;
  if ((((int)(short)uVar1 & 1U) != 0) || (bVar5 = false, srcLength < 0)) goto LAB_002e5e4c;
  if (srcLength != 0) {
    if ((uVar1 & 2) == 0) {
      srcChars = (this->_primaryID).fUnion.fFields.fArray;
    }
    else {
      srcChars = (this->_primaryID).fUnion.fStackFields.fBuffer;
    }
    iVar3 = UnicodeString::indexOf(&UStack_58,srcChars,0,srcLength,0,length);
    if (iVar3 == 0) {
      if (-1 < UStack_58.fUnion.fStackFields.fLengthAndFlags) {
        UStack_58.fUnion.fFields.fLength = (int)UStack_58.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar2 = (this->_primaryID).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        uVar4 = (this->_primaryID).fUnion.fFields.fLength;
      }
      else {
        uVar4 = (int)sVar2 >> 5;
      }
      bVar5 = true;
      if (UStack_58.fUnion.fFields.fLength == uVar4) goto LAB_002e5e4c;
      if (uVar4 < (uint)UStack_58.fUnion.fFields.fLength) {
        if (((int)UStack_58.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          UStack_58.fUnion.fFields.fArray = UStack_58.fUnion.fStackFields.fBuffer;
        }
        bVar5 = *(char16_t *)((long)UStack_58.fUnion.fFields.fArray + (long)(int)uVar4 * 2) == L'_';
        goto LAB_002e5e4c;
      }
    }
  }
  bVar5 = false;
LAB_002e5e4c:
  UnicodeString::~UnicodeString(&UStack_58);
  return bVar5;
}

Assistant:

UBool
LocaleKey::isFallbackOf(const UnicodeString& id) const {
    UnicodeString temp(id);
    parseSuffix(temp);
    return temp.indexOf(_primaryID) == 0 &&
        (temp.length() == _primaryID.length() ||
        temp.charAt(_primaryID.length()) == UNDERSCORE_CHAR);
}